

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCovDeriveRegular(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    pAVar1 = Abc_AigConst1(pNtk);
    if (0 < (pAVar1->vFanouts).nSize) {
      pAVar1 = Abc_NtkCreateNodeConst1(pNtk_00);
      pAVar2 = Abc_AigConst1(pNtk);
      (pAVar2->field_6).pCopy = pAVar1;
    }
    for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = Abc_NtkCo(pNtk,iVar3);
      pAVar2 = Abc_NtkCovDerive_rec
                         (p,pNtk_00,
                          (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
      if ((pAVar1->field_0x15 & 4) != 0) {
        if (((char *)(pAVar2->field_5).pData == (char *)0x0) ||
           (*(int *)((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x2c) != 1)) {
          pAVar2 = Abc_NtkCreateNodeInv(pNtk_00,pAVar2);
        }
        else {
          Abc_SopComplement((char *)(pAVar2->field_5).pData);
        }
      }
      Abc_ObjAddFanin((pAVar1->field_6).pCopy,pAVar2);
    }
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    iVar3 = Abc_NtkCheck(pNtk_00);
    if (iVar3 == 0) {
      puts("Abc_NtkCovDerive: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                ,0x1fc,"Abc_Ntk_t *Abc_NtkCovDeriveRegular(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDeriveRegular( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNodeNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    if ( Abc_ObjFanoutNum(Abc_AigConst1(pNtk)) > 0 )
        Abc_AigConst1(pNtk)->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pNodeNew = Abc_NtkCovDerive_rec( p, pNtkNew, Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninC0(pObj) )
        {
            if ( pNodeNew->pData && Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) == 1 )
                Abc_SopComplement( (char *)pNodeNew->pData );
            else
                pNodeNew = Abc_NtkCreateNodeInv( pNtkNew, pNodeNew );
        }
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }
    // add the COs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDerive: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}